

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::checkLimits(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double *pdVar1;
  HighsLp *pHVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  Result RVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar11 = (long)(postsolve_stack->reductions).
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(postsolve_stack->reductions).
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)uVar11 >> 4;
  uVar6 = debugGetCheckCol(this);
  uVar7 = debugGetCheckRow(this);
  uVar9 = (ulong)uVar7;
  if ((int)(uVar7 & uVar6) < 0) {
    bVar3 = true;
    bVar4 = true;
    bVar5 = true;
    goto LAB_00312678;
  }
  bVar5 = true;
  bVar4 = true;
  if (-1 < (int)uVar6) {
    if (uVar11 == 0x10) {
LAB_003125f3:
      bVar4 = false;
    }
    else {
      pdVar1 = (this->model->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start + uVar6;
      if ((postsolve_stack->debug_prev_col_lower != *pdVar1) ||
         (NAN(postsolve_stack->debug_prev_col_lower) || NAN(*pdVar1))) goto LAB_003125f3;
      bVar4 = (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] == postsolve_stack->debug_prev_col_upper;
    }
    pHVar2 = this->model;
    postsolve_stack->debug_prev_col_lower =
         (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6];
    postsolve_stack->debug_prev_col_upper =
         (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6];
  }
  if (-1 < (int)uVar7) {
    if (uVar11 == 0x10) {
LAB_00312641:
      bVar5 = false;
    }
    else {
      pdVar1 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start + uVar9;
      if ((postsolve_stack->debug_prev_row_lower != *pdVar1) ||
         (NAN(postsolve_stack->debug_prev_row_lower) || NAN(*pdVar1))) goto LAB_00312641;
      bVar5 = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] == postsolve_stack->debug_prev_row_upper;
    }
    pHVar2 = this->model;
    postsolve_stack->debug_prev_row_lower =
         (pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar9];
    postsolve_stack->debug_prev_row_upper =
         (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar9];
  }
  bVar3 = uVar10 <= postsolve_stack->debug_prev_numreductions;
LAB_00312678:
  if (((-1 < (int)uVar6) && (!bVar4)) && (!bVar3)) {
    pHVar2 = this->model;
    printf("After reduction %4d: col = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6],
           (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6],(ulong)((int)uVar10 - 1),(ulong)uVar6,
           (pHVar2->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p);
    postsolve_stack->debug_prev_numreductions = uVar10;
  }
  if (!(bool)(bVar5 | bVar3 | (int)uVar7 < 0)) {
    pHVar2 = this->model;
    printf("After reduction %4d: row = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           (pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9],
           (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9],(ulong)((int)uVar10 - 1),uVar9,
           (pHVar2->row_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
    postsolve_stack->debug_prev_numreductions = uVar10;
  }
  if (((uVar11 & 0x3ff0) == 0) && (RVar8 = checkTimeLimit(this), RVar8 != kOk)) {
    return RVar8;
  }
  return (uint)(this->reductionLimit <= uVar10) * 3;
}

Assistant:

HPresolve::Result HPresolve::checkLimits(HighsPostsolveStack& postsolve_stack) {
  size_t numreductions = postsolve_stack.numReductions();

  bool debug_report = false;
  HighsInt check_col = debugGetCheckCol();
  HighsInt check_row = debugGetCheckRow();
  bool col_bound_change = false;
  bool row_bound_change = false;
  if (check_col >= 0 || check_row >= 0) {
    if (check_col >= 0) {
      col_bound_change =
          numreductions == 1 ||
          postsolve_stack.debug_prev_col_lower !=
              model->col_lower_[check_col] ||
          postsolve_stack.debug_prev_col_upper != model->col_upper_[check_col];
      postsolve_stack.debug_prev_col_lower = model->col_lower_[check_col];
      postsolve_stack.debug_prev_col_upper = model->col_upper_[check_col];
    }
    if (check_row >= 0) {
      row_bound_change =
          numreductions == 1 ||
          postsolve_stack.debug_prev_row_lower !=
              model->row_lower_[check_row] ||
          postsolve_stack.debug_prev_row_upper != model->row_upper_[check_row];
      postsolve_stack.debug_prev_row_lower = model->row_lower_[check_row];
      postsolve_stack.debug_prev_row_upper = model->row_upper_[check_row];
    }
    debug_report = numreductions > postsolve_stack.debug_prev_numreductions;
  }
  if (check_col >= 0 && col_bound_change && debug_report) {
    printf("After reduction %4d: col = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           static_cast<int>(numreductions - 1), static_cast<int>(check_col),
           model->col_names_[check_col].c_str(), model->col_lower_[check_col],
           model->col_upper_[check_col]);
    postsolve_stack.debug_prev_numreductions = numreductions;
  }
  if (check_row >= 0 && row_bound_change && debug_report) {
    printf("After reduction %4d: row = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           static_cast<int>(numreductions - 1), static_cast<int>(check_row),
           model->row_names_[check_row].c_str(), model->row_lower_[check_row],
           model->row_upper_[check_row]);
    postsolve_stack.debug_prev_numreductions = numreductions;
  }

  if ((numreductions & 1023u) == 0) HPRESOLVE_CHECKED_CALL(checkTimeLimit());

  return numreductions >= reductionLimit ? Result::kStopped : Result::kOk;
}